

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void WindowSettingsHandler_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  int iVar1;
  int y;
  int x;
  int i;
  int local_1c;
  ushort local_18 [2];
  int local_14;
  
  iVar1 = __isoc99_sscanf(line,"Pos=%i,%i",local_18,&local_1c);
  if (iVar1 == 2) {
    *(uint *)((long)entry + 4) = local_1c << 0x10 | (uint)local_18[0];
  }
  else {
    iVar1 = __isoc99_sscanf(line,"Size=%i,%i",local_18,&local_1c);
    if (iVar1 == 2) {
      *(uint *)((long)entry + 8) = local_1c << 0x10 | (uint)local_18[0];
    }
    else {
      iVar1 = __isoc99_sscanf(line,"Collapsed=%d",&local_14);
      if (iVar1 == 1) {
        *(bool *)((long)entry + 0xc) = local_14 != 0;
      }
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    int x, y;
    int i;
    if (sscanf(line, "Pos=%i,%i", &x, &y) == 2)         settings->Pos = ImVec2ih((short)x, (short)y);
    else if (sscanf(line, "Size=%i,%i", &x, &y) == 2)   settings->Size = ImVec2ih((short)x, (short)y);
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     settings->Collapsed = (i != 0);
}